

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent.cpp
# Opt level: O2

void __thiscall libtorrent::aux::torrent::on_inactivity_tick(torrent *this,error_code *ec)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  
  this->field_0x5db = this->field_0x5db & 0xfb;
  if (ec->failed_ == false) {
    bVar1 = is_inactive_internal(this);
    if (((*(uint *)&this->field_0x600 & 0x40) == 0) == bVar1) {
      *(uint *)&this->field_0x600 = *(uint *)&this->field_0x600 & 0xffffffbf | (uint)bVar1 << 6;
      update_state_list(this);
      update_want_tick(this);
      iVar2 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger).
                _vptr_session_logger[0x2e])();
      bVar1 = session_settings::get_bool((session_settings *)CONCAT44(extraout_var,iVar2),0x800d);
      if (bVar1) {
        (*(((this->super_torrent_hot_members).m_ses)->super_session_logger)._vptr_session_logger
          [0x2c])();
      }
    }
  }
  return;
}

Assistant:

void torrent::on_inactivity_tick(error_code const& ec) try
	{
		m_pending_active_change = false;

		if (ec) return;

		bool const is_inactive = is_inactive_internal();
		if (is_inactive == m_inactive) return;

		m_inactive = is_inactive;

		update_state_list();
		update_want_tick();

		if (settings().get_bool(settings_pack::dont_count_slow_torrents))
			m_ses.trigger_auto_manage();
	}
	catch (...) { handle_exception(); }